

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.hpp
# Opt level: O2

string * cfgfile::
         format_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::wstring_trait_t>
         ::from_string(string *__return_storage_ptr__,
                      parser_info_t<cfgfile::wstring_trait_t> *param_1,string_t *value)

{
  size_type sVar1;
  long lVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  sVar1 = value->_M_string_length;
  for (lVar2 = 0; sVar1 << 2 != lVar2; lVar2 = lVar2 + 4) {
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string from_string( const parser_info_t< wstring_trait_t > &,
		const wstring_trait_t::string_t & value )
	{
		std::string res;

		for( const auto & ch : value )
			res.push_back( static_cast< char > ( ch ) );

		return res;
	}